

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_3::DBIter::~DBIter(DBIter *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ~DBIter(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0xa8);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~DBIter() override { delete iter_; }